

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

void decompressBlockETC2c
               (uint block_part1,uint block_part2,uint8 *img,int width,int height,int startx,
               int starty,int channels)

{
  byte bVar1;
  int in_ECX;
  uint8 *in_RDX;
  uint in_ESI;
  uint in_EDI;
  int in_R8D;
  int in_R9D;
  uint unaff_retaddr;
  uint unaff_retaddr_00;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  uint in_stack_00000010;
  uint block57_part2;
  uint block57_part1;
  uint block58_part2;
  uint block58_part1;
  uint block59_part2;
  uint block59_part1;
  char blue;
  char green;
  char red;
  char diff [3];
  char color1 [3];
  int diffbit;
  int in_stack_0000005c;
  int in_stack_00000064;
  undefined4 in_stack_0000006c;
  uint in_stack_00000070;
  uint in_stack_00000074;
  int in_stack_00000080;
  int in_stack_00000088;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  char local_29;
  char local_28;
  char local_27;
  char local_26;
  char local_25;
  char local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  uint local_20;
  int local_1c;
  int local_18;
  
  local_20 = in_EDI >> 1 & 1;
  if (local_20 == 0) {
    decompressBlockDiffFlipC
              (in_stack_00000074,in_stack_00000070,(uint8 *)CONCAT44(in_stack_0000006c,channels),
               in_stack_00000064,starty,in_stack_0000005c,in_stack_00000080,in_stack_00000088);
  }
  else {
    bVar1 = (byte)(in_EDI >> 0x18);
    local_23 = bVar1 >> 3;
    local_22 = (byte)(in_EDI >> 0x13) & 0x1f;
    local_21 = (byte)(in_EDI >> 0xb) & 0x1f;
    local_26 = (char)(bVar1 << 5) >> 5;
    local_25 = (char)((char)(in_EDI >> 0x10) << 5) >> 5;
    local_24 = (char)((char)(in_EDI >> 8) << 5) >> 5;
    local_27 = local_23 + local_26;
    local_28 = local_22 + local_25;
    local_29 = local_21 + local_24;
    if ((local_27 < '\0') || ('\x1f' < local_27)) {
      unstuff59bits(in_EDI,in_ESI,&local_30,&local_34);
      decompressBlockTHUMB59Tc
                (unaff_retaddr_00,unaff_retaddr,(uint8 *)CONCAT44(in_EDI,in_ESI),
                 (int)((ulong)in_RDX >> 0x20),(int)in_RDX,in_ECX,in_stack_00000010,block57_part1);
    }
    else if ((local_28 < '\0') || ('\x1f' < local_28)) {
      unstuff58bits(in_EDI,in_ESI,&local_38,&local_3c);
      decompressBlockTHUMB58Hc
                (block57_part2,in_stack_00000010,
                 (uint8 *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr_00,
                 unaff_retaddr,in_EDI,block58_part1,block59_part1);
    }
    else if ((local_29 < '\0') || ('\x1f' < local_29)) {
      local_1c = in_R9D;
      local_18 = in_R8D;
      unstuff57bits(in_EDI,in_ESI,&local_40,&local_44);
      decompressBlockPlanar57c
                (local_40,local_44,in_RDX,in_ECX,local_18,local_1c,in_stack_00000008,
                 in_stack_00000010);
    }
    else {
      decompressBlockDiffFlipC
                (in_stack_00000074,in_stack_00000070,(uint8 *)CONCAT44(in_stack_0000006c,channels),
                 in_stack_00000064,starty,in_stack_0000005c,in_stack_00000080,in_stack_00000088);
    }
  }
  return;
}

Assistant:

void decompressBlockETC2c(unsigned int block_part1, unsigned int block_part2, uint8 *img, int width, int height, int startx, int starty, int channels)
{
	int diffbit;
	signed char color1[3];
	signed char diff[3];
	signed char red, green, blue;

	diffbit = (GETBITSHIGH(block_part1, 1, 33));

	if( diffbit )
	{
		// We have diffbit = 1;

		// Base color
		color1[0]= GETBITSHIGH(block_part1, 5, 63);
		color1[1]= GETBITSHIGH(block_part1, 5, 55);
		color1[2]= GETBITSHIGH(block_part1, 5, 47);

		// Diff color
		diff[0]= GETBITSHIGH(block_part1, 3, 58);
		diff[1]= GETBITSHIGH(block_part1, 3, 50);
		diff[2]= GETBITSHIGH(block_part1, 3, 42);

		// Extend sign bit to entire byte. 
		diff[0] = (diff[0] << 5);
		diff[1] = (diff[1] << 5);
		diff[2] = (diff[2] << 5);
		diff[0] = diff[0] >> 5;
		diff[1] = diff[1] >> 5;
		diff[2] = diff[2] >> 5;

		red   = color1[0] + diff[0];
		green = color1[1] + diff[1];
		blue  = color1[2] + diff[2];

		if(red < 0 || red > 31)
		{
			unsigned int block59_part1, block59_part2;
			unstuff59bits(block_part1, block_part2, block59_part1, block59_part2);
			decompressBlockTHUMB59Tc(block59_part1, block59_part2, img, width, height, startx, starty, channels);
		}
		else if (green < 0 || green > 31)
		{
			unsigned int block58_part1, block58_part2;
			unstuff58bits(block_part1, block_part2, block58_part1, block58_part2);
			decompressBlockTHUMB58Hc(block58_part1, block58_part2, img, width, height, startx, starty, channels);
		}
		else if(blue < 0 || blue > 31)
		{
			unsigned int block57_part1, block57_part2;

			unstuff57bits(block_part1, block_part2, block57_part1, block57_part2);
			decompressBlockPlanar57c(block57_part1, block57_part2, img, width, height, startx, starty, channels);
		}
		else
		{
 			decompressBlockDiffFlipC(block_part1, block_part2, img, width, height, startx, starty, channels);
		}
	}
	else
	{
		// We have diffbit = 0;
		decompressBlockDiffFlipC(block_part1, block_part2, img, width, height, startx, starty, channels);
	}
}